

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

int runner(TestReporter *reporter,char *test_library_name,char *suite_name,char *test_name,
          _Bool verbose,_Bool dont_run)

{
  undefined8 uVar1;
  _Bool _Var2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  CgreenVector *tests;
  size_t sVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uVar10;
  long lVar11;
  TestItem *pTVar12;
  undefined8 *puVar13;
  undefined8 uVar14;
  long lVar15;
  ContextSuite *pCVar16;
  TestSuite *pTVar17;
  ContextSuite *suite;
  int i;
  int iVar18;
  ContextSuite *local_78;
  char *local_68;
  
  tests = discover_tests_in(test_library_name,verbose);
  iVar3 = cgreen_vector_size(tests);
  if (iVar3 == 0) {
    __printf_chk(1,"No tests found in \'%s\'.\n",test_library_name);
    return 1;
  }
  if (verbose) {
    uVar4 = cgreen_vector_size(tests);
    __printf_chk(1,"Discovered %d test(s)\n",uVar4);
  }
  if (((ulong)(byte)*test_library_name < 0x30) &&
     ((0xc00000000001U >> ((ulong)(byte)*test_library_name & 0x3f) & 1) != 0)) {
    local_68 = strdup(test_library_name);
  }
  else {
    sVar6 = strlen(test_library_name);
    local_68 = (char *)malloc(sVar6 + 3);
    local_68[0] = '.';
    local_68[1] = '/';
    local_68[2] = '\0';
    strcat(local_68,test_library_name);
  }
  uVar7 = create_cgreen_vector(destroy_test_item);
  while (iVar3 = cgreen_vector_size(tests), 1 < iVar3) {
    iVar3 = 0;
    pcVar8 = test_name_of_element(tests,0);
    for (iVar18 = 1; iVar5 = cgreen_vector_size(tests), iVar18 < iVar5; iVar18 = iVar18 + 1) {
      pcVar9 = test_name_of_element(tests,iVar18);
      iVar5 = strcmp(pcVar8,pcVar9);
      if (0 < iVar5) {
        pcVar8 = test_name_of_element(tests,iVar18);
        iVar3 = iVar18;
      }
    }
    cgreen_vector_remove(tests,iVar3);
    cgreen_vector_add(uVar7);
  }
  iVar3 = cgreen_vector_size(tests);
  if (iVar3 == 1) {
    uVar10 = cgreen_vector_remove(tests,0);
    cgreen_vector_add(uVar7,uVar10);
    destroy_cgreen_vector(tests);
  }
  if (verbose) {
    __printf_chk(1,"Opening [%s]",test_library_name);
  }
  lVar11 = dlopen(local_68,2);
  if (lVar11 == 0) {
    uVar7 = dlerror();
    panic("tools/runner.c",0x12e,"dlopen failure when trying to run \'%s\' (error: %s)\n",local_68,
          uVar7);
  }
  iVar3 = 0;
  if (!dont_run) {
    uVar10 = create_named_test_suite_(suite_name,"tools/runner.c",0xc3);
    local_78 = (ContextSuite *)0x0;
    iVar3 = 0;
    for (iVar18 = 0; iVar5 = cgreen_vector_size(uVar7), iVar18 < iVar5; iVar18 = iVar18 + 1) {
      if (test_name == (char *)0x0) {
LAB_00103150:
        puVar13 = (undefined8 *)cgreen_vector_get(uVar7,iVar18);
        uVar1 = *puVar13;
        uVar14 = dlsym(lVar11,uVar1);
        lVar15 = dlerror();
        if (lVar15 != 0) {
          panic("tools/runner.c",0x98,"Could not find specification_name symbol \'%s\'",uVar1);
        }
        lVar15 = cgreen_vector_get(uVar7,iVar18);
        pcVar8 = *(char **)(lVar15 + 8);
        for (pCVar16 = local_78; pCVar16 != (ContextSuite *)0x0; pCVar16 = pCVar16->next) {
          iVar5 = strcmp(pCVar16->context_name,pcVar8);
          if (iVar5 == 0) {
            pTVar17 = pCVar16->suite;
            if (pTVar17 != (TestSuite *)0x0) goto LAB_00103208;
            break;
          }
        }
        pCVar16 = (ContextSuite *)calloc(1,0x18);
        pcVar9 = (char *)string_dup(pcVar8);
        pCVar16->context_name = pcVar9;
        pTVar17 = (TestSuite *)create_named_test_suite_(pcVar8,"tools/runner.c",0x6d);
        pCVar16->suite = pTVar17;
        pCVar16->next = local_78;
        add_suite_(uVar10,pcVar8,pTVar17);
        local_78 = pCVar16;
LAB_00103208:
        add_test_(pTVar17,*(undefined8 *)(lVar15 + 0x10),uVar14);
        iVar3 = iVar3 + 1;
      }
      else {
        pTVar12 = (TestItem *)cgreen_vector_get(uVar7,iVar18);
        _Var2 = test_matches_pattern(test_name,pTVar12);
        if (_Var2) goto LAB_00103150;
      }
    }
    if (iVar3 < 0) {
      iVar3 = 1;
    }
    else {
      if (iVar3 == 1 && test_name != (char *)0x0) {
        iVar3 = 0;
        do {
          iVar5 = iVar3;
          iVar18 = cgreen_vector_size(uVar7);
          if (iVar18 <= iVar5) break;
          pTVar12 = (TestItem *)cgreen_vector_get(uVar7,iVar5);
          _Var2 = test_matches_pattern(test_name,pTVar12);
          iVar3 = iVar5 + 1;
        } while (!_Var2);
        if (verbose) {
          __printf_chk(1," to only run one test: \'%s\' ...\n",test_name);
        }
        if (iVar18 <= iVar5) {
          iVar3 = 1;
          __fprintf_chk(_stderr,1,"ERROR: No such test: \'%s\' in \'%s\'\n",test_name,suite_name);
          goto LAB_001033d3;
        }
        pcVar8 = test_name_of(test_name);
        iVar3 = run_single_test(uVar10,pcVar8,reporter);
        free(pcVar8);
      }
      else {
        if (verbose) {
          iVar18 = cgreen_vector_size(uVar7);
          if (iVar3 == iVar18) {
            iVar18 = cgreen_vector_size(uVar7);
            pcVar8 = " to run all %d discovered tests ...\n";
          }
          else {
            pcVar8 = " to run %d matching tests ...\n";
            iVar18 = iVar3;
          }
          __printf_chk(1,pcVar8,iVar18);
        }
        if (iVar3 == 0) {
          iVar3 = 1;
          __fprintf_chk(_stderr,1,"ERROR: No such test: \'%s\' in \'%s\'\n",test_name,suite_name);
        }
        else {
          iVar3 = run_test_suite(uVar10,reporter);
        }
      }
      destroy_test_suite(uVar10);
      destroy_context_suites(local_78);
    }
  }
LAB_001033d3:
  dlclose(lVar11);
  free(local_68);
  destroy_cgreen_vector(uVar7);
  return iVar3;
}

Assistant:

int runner(TestReporter *reporter, const char *test_library_name,
           const char *suite_name, const char *test_name,
           bool verbose, bool dont_run) {
    int status = 0;
    void *test_library_handle = NULL;

    CgreenVector *tests = discover_tests_in(test_library_name, verbose);

    if (count(tests) == 0) {
        printf("No tests found in '%s'.\n", test_library_name);
        return 1;
    }

    if (verbose)
        printf("Discovered %d test(s)\n", count(tests));

    char *absolute_library_name = absolute(test_library_name);
    tests = sorted_test_items_from(tests);
    if (verbose)
        printf("Opening [%s]", test_library_name);
    test_library_handle = dlopen(absolute_library_name, RTLD_NOW);
    if (test_library_handle == NULL) {
        PANIC("dlopen failure when trying to run '%s' (error: %s)\n",
              absolute_library_name, dlerror());
        status = 2;
    } else {
        if (!dont_run) {
            status = run_tests(reporter, suite_name, test_name, test_library_handle,
                               tests, verbose);
        }
        dlclose(test_library_handle);
    }
    free(absolute_library_name);

    destroy_cgreen_vector(tests);

    return status;
}